

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedParams>::
~DrawTestInstance(DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this)

{
  DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this_local;
  
  (this->super_DrawTestInstanceBase).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__DrawTestInstance_016ae438;
  DrawIndexedParams::~DrawIndexedParams(&this->m_data);
  DrawTestInstanceBase::~DrawTestInstanceBase(&this->super_DrawTestInstanceBase);
  return;
}

Assistant:

DrawTestInstance<T>::~DrawTestInstance (void)
{
}